

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

optional<cmStandardLevel> __thiscall
anon_unknown.dwarf_a155d9::StandardLevelComputer::CompileFeatureStandardLevel
          (StandardLevelComputer *this,cmMakefile *makefile,string *feature)

{
  bool bVar1;
  cmValue cVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  _Storage<cmStandardLevel,_true> _Var6;
  optional<cmStandardLevel> oVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  _Storage<cmStandardLevel,_true> local_a0;
  cmList props;
  string prefix;
  string local_50;
  
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&>
            (&prefix,(char (*) [7])0x72bb95,&this->Language);
  lVar4 = 0;
  uVar5 = 0;
  for (_Var6 = (_Storage<cmStandardLevel,_true>)0x0;
      (ulong)_Var6 <
      (ulong)((long)(this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2);
      _Var6 = (_Storage<cmStandardLevel,_true>)((long)_Var6 + 1)) {
    cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[18]>
              (&local_50,&prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(((this->LevelsAsStrings).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4),
               (char (*) [18])0x75b532);
    cVar2 = cmMakefile::GetDefinition(makefile,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (cVar2.Value != (string *)0x0) {
      std::__cxx11::string::string((string *)&local_50,(string *)cVar2.Value);
      init._M_len = 1;
      init._M_array = &local_50;
      cmList::cmList(&props,init);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = ::cm::
              contains<cmList,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&props,feature);
      uVar3 = (uint)uVar5;
      if (uVar5 == 0) {
        uVar3 = 1;
      }
      if (bVar1) {
        uVar5 = (ulong)uVar3;
        local_a0 = _Var6;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&props.Values);
    }
    lVar4 = lVar4 + 0x20;
  }
  std::__cxx11::string::~string((string *)&prefix);
  oVar7.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
  super__Optional_payload_base<cmStandardLevel>._8_8_ = uVar5;
  oVar7.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
  super__Optional_payload_base<cmStandardLevel>._M_payload = local_a0;
  return (optional<cmStandardLevel>)
         oVar7.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
         super__Optional_payload_base<cmStandardLevel>;
}

Assistant:

cm::optional<cmStandardLevel> CompileFeatureStandardLevel(
    cmMakefile* makefile, std::string const& feature) const
  {
    std::string prefix = cmStrCat("CMAKE_", this->Language);
    cm::optional<cmStandardLevel> maxLevel;
    for (size_t i = 0; i < this->Levels.size(); ++i) {
      if (cmValue prop = makefile->GetDefinition(
            cmStrCat(prefix, this->LevelsAsStrings[i], "_COMPILE_FEATURES"))) {
        cmList props{ *prop };
        if (cm::contains(props, feature)) {
          maxLevel = cmStandardLevel(i);
        }
      }
    }
    return maxLevel;
  }